

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O1

string * __thiscall
Diligent::FormatString<char[33],char[23],unsigned_long,char[22],unsigned_int,char[50]>
          (string *__return_storage_ptr__,Diligent *this,char (*Args) [33],char (*Args_1) [23],
          unsigned_long *Args_2,char (*Args_3) [22],uint *Args_4,char (*Args_5) [50])

{
  stringstream ss;
  stringstream local_1b8 [128];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  FormatStrSS<std::__cxx11::stringstream,char[33],char[23],unsigned_long,char[22],unsigned_int,char[50]>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
             (char (*) [33])this,(char (*) [23])Args,(unsigned_long *)Args_1,(char (*) [22])Args_2,
             (uint *)Args_3,(char (*) [50])Args_4);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}